

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_tran_pipe_stop(void *arg)

{
  nni_mtx *mtx;
  sfd_tran_ep *ep;
  sfd_tran_pipe *p;
  void *arg_local;
  
  mtx = *(nni_mtx **)((long)arg + 0x38);
  nni_aio_stop((nni_aio *)((long)arg + 0x268));
  nni_aio_stop((nni_aio *)((long)arg + 0xa0));
  nni_aio_stop((nni_aio *)((long)arg + 0x430));
  nni_mtx_lock(mtx);
  nni_list_node_remove((nni_list_node *)((long)arg + 0x28));
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
sfd_tran_pipe_stop(void *arg)
{
	sfd_tran_pipe *p  = arg;
	sfd_tran_ep   *ep = p->ep;

	nni_aio_stop(&p->rxaio);
	nni_aio_stop(&p->txaio);
	nni_aio_stop(&p->negoaio);
	nni_mtx_lock(&ep->mtx);
	nni_list_node_remove(&p->node);
	nni_mtx_unlock(&ep->mtx);
}